

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall
GlobOpt::TypeSpecializeIntBinary
          (GlobOpt *this,Instr **pInstr,Value *src1Val,Value *src2Val,Value **pDstVal,int32 min,
          int32 max,bool skipDst)

{
  code *pcVar1;
  bool bVar2;
  ValueInfo *pVVar3;
  Opnd *pOVar4;
  undefined4 *puVar5;
  Opnd *dst;
  Opnd *src2;
  Opnd *src1;
  Opnd *elementOpnd;
  int32 local_58;
  bool isIntConstMissingItem;
  int32 intConstantValue;
  bool lossy;
  Instr **instr;
  bool skipDst_local;
  Value **ppVStack_40;
  int32 min_local;
  Value **pDstVal_local;
  Value *src2Val_local;
  Value *src1Val_local;
  Instr **pInstr_local;
  GlobOpt *this_local;
  
  instr._3_1_ = skipDst;
  isIntConstMissingItem = false;
  _intConstantValue = pInstr;
  instr._4_4_ = min;
  ppVStack_40 = pDstVal;
  pDstVal_local = (Value **)src2Val;
  src2Val_local = src1Val;
  src1Val_local = (Value *)pInstr;
  pInstr_local = (Instr **)this;
  bVar2 = OpCodeAttr::IsInlineBuiltIn((*pInstr)->m_opcode);
  if (bVar2) {
    if ((*_intConstantValue)->m_opcode == InlineArrayPush) {
      pVVar3 = ::Value::GetValueInfo((Value *)pDstVal_local);
      elementOpnd._7_1_ = ValueInfo::TryGetIntConstantValue(pVVar3,&local_58,false);
      if (elementOpnd._7_1_) {
        elementOpnd._7_1_ = Js::SparseArraySegment<int>::IsMissingItem(&local_58);
      }
      pVVar3 = ::Value::GetValueInfo((Value *)pDstVal_local);
      bVar2 = ValueType::IsLikelyInt(&pVVar3->super_ValueType);
      if ((!bVar2) || (elementOpnd._7_1_ != false)) {
        return false;
      }
      pOVar4 = IR::Instr::GetSrc2(*_intConstantValue);
      ToInt32(this,*_intConstantValue,pOVar4,this->currentBlock,(Value *)pDstVal_local,
              (IndirOpnd *)0x0,(bool)(isIntConstMissingItem & 1));
    }
    else {
      pOVar4 = IR::Instr::GetSrc1(*_intConstantValue);
      ToInt32(this,*_intConstantValue,pOVar4,this->currentBlock,src2Val_local,(IndirOpnd *)0x0,
              (bool)(isIntConstMissingItem & 1));
      pOVar4 = IR::Instr::GetSrc2(*_intConstantValue);
      ToInt32(this,*_intConstantValue,pOVar4,this->currentBlock,(Value *)pDstVal_local,
              (IndirOpnd *)0x0,(bool)(isIntConstMissingItem & 1));
    }
    if (((instr._3_1_ & 1) == 0) &&
       (pOVar4 = IR::Instr::GetDst(*_intConstantValue), pOVar4 != (Opnd *)0x0)) {
      TypeSpecializeIntDst
                (this,*_intConstantValue,(*_intConstantValue)->m_opcode,(Value *)0x0,src2Val_local,
                 (Value *)pDstVal_local,BailOutInvalid,instr._4_4_,max,ppVStack_40,
                 (AddSubConstantInfo *)0x0);
    }
    this_local._7_1_ = true;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1f75,"(false)","Yet to move code for other binary functions here");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
GlobOpt::TypeSpecializeIntBinary(IR::Instr **pInstr, Value *src1Val, Value *src2Val, Value **pDstVal, int32 min, int32 max, bool skipDst /* = false */)
{
    // Consider moving the code for int type spec-ing binary functions here.
    IR::Instr *&instr = *pInstr;
    bool lossy = false;

    if(OpCodeAttr::IsInlineBuiltIn(instr->m_opcode))
    {
        if(instr->m_opcode == Js::OpCode::InlineArrayPush)
        {
            int32 intConstantValue;
            bool isIntConstMissingItem = src2Val->GetValueInfo()->TryGetIntConstantValue(&intConstantValue);

            if(isIntConstMissingItem)
            {
                isIntConstMissingItem = Js::SparseArraySegment<int>::IsMissingItem(&intConstantValue);
            }

            // Don't specialize if the element is not likelyInt or an IntConst which is a missing item value.
            if(!(src2Val->GetValueInfo()->IsLikelyInt()) || isIntConstMissingItem)
            {
                return false;
            }
            // We don't want to specialize both the source operands, though it is a binary instr.
            IR::Opnd * elementOpnd = instr->GetSrc2();
            this->ToInt32(instr, elementOpnd, this->currentBlock, src2Val, nullptr, lossy);
        }
        else
        {
            IR::Opnd *src1 = instr->GetSrc1();
            this->ToInt32(instr, src1, this->currentBlock, src1Val, nullptr, lossy);

            IR::Opnd *src2 = instr->GetSrc2();
            this->ToInt32(instr, src2, this->currentBlock, src2Val, nullptr, lossy);
        }

        if(!skipDst)
        {
            IR::Opnd *dst = instr->GetDst();
            if (dst)
            {
                TypeSpecializeIntDst(instr, instr->m_opcode, nullptr, src1Val, src2Val, IR::BailOutInvalid, min, max, pDstVal);
            }
        }
        return true;
    }
    else
    {
        AssertMsg(false, "Yet to move code for other binary functions here");
        return false;
    }
}